

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O0

size_t utf8::CharacterIndexToByteIndex
                 (LPCUTF8 pch,size_t cbLength,charcount_t cchIndex,size_t cbStartIndex,
                 charcount_t cchStartIndex,DecodeOptions options)

{
  bool bVar1;
  size_t local_68;
  uint local_54;
  uint32 ch4;
  charcount_t i;
  LPCUTF8 pchEndMinus4;
  LPCUTF8 pchEnd;
  LPCUTF8 pchCurrent;
  DecodeOptions local_30;
  DecodeOptions localOptions;
  DecodeOptions options_local;
  charcount_t cchStartIndex_local;
  size_t cbStartIndex_local;
  size_t sStack_18;
  charcount_t cchIndex_local;
  size_t cbLength_local;
  LPCUTF8 pch_local;
  
  pchEnd = pch + cbStartIndex;
  local_54 = cchIndex - cchStartIndex;
  pchCurrent._4_4_ = options;
  local_30 = options;
  localOptions = cchStartIndex;
  _options_local = cbStartIndex;
  cbStartIndex_local._4_4_ = cchIndex;
  sStack_18 = cbLength;
  cbLength_local = (size_t)pch;
  bVar1 = IsAligned(pchEnd);
  if (bVar1) goto LAB_008d446c;
  while (pchEnd < pch + cbLength && local_54 != 0) {
    Decode(&pchEnd,pch + cbLength,(DecodeOptions *)((long)&pchCurrent + 4),(bool *)0x0);
    local_54 = local_54 - 1;
    if ((4 < local_54) && (bVar1 = IsAligned(pchEnd), bVar1)) {
LAB_008d446c:
      for (; (pchEnd < pch + (cbLength - 4) && 4 < local_54 && ((*(uint *)pchEnd & 0x80808080) == 0)
             ); pchEnd = pchEnd + 4) {
        local_54 = local_54 - 4;
      }
    }
  }
  if (local_54 == 0) {
    local_68 = (long)pchEnd - cbLength_local;
  }
  else {
    local_68 = sStack_18;
  }
  return local_68;
}

Assistant:

size_t CharacterIndexToByteIndex(__in_ecount(cbLength) LPCUTF8 pch, size_t cbLength, const charcount_t cchIndex, size_t cbStartIndex, charcount_t cchStartIndex, DecodeOptions options)
    {
        DecodeOptions localOptions = options;
        LPCUTF8 pchCurrent = pch + cbStartIndex;
        LPCUTF8 pchEnd = pch + cbLength;
        LPCUTF8 pchEndMinus4 = pch + (cbLength - 4);
        charcount_t i = cchIndex - cchStartIndex;

        // Avoid using a reinterpret_cast to start a misaligned read.
        if (!IsAligned(pchCurrent)) goto LSlowPath;
LFastPath:
        // Skip 4 bytes at a time.
        while (pchCurrent < pchEndMinus4 && i > 4)
        {
            uint32 ch4 = *reinterpret_cast<const uint32 *>(pchCurrent);
            if ((ch4 & 0x80808080) == 0)
            {
                pchCurrent += 4;
                i -= 4;
            }
            else break;
        }

LSlowPath:
        while (pchCurrent < pchEnd && i > 0)
        {
            Decode(pchCurrent, pchEnd, localOptions);
            i--;

            // Try to return to the fast path avoiding misaligned reads.
            if (i > 4 && IsAligned(pchCurrent)) goto LFastPath;
        }
        return i > 0 ? cbLength : pchCurrent - pch;
    }